

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O3

int InternStrnicmp(char *s1,char *s2,size_t n)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  
  if (s2 != (char *)0x0) {
    if (n == 0) {
      return 0;
    }
    lVar4 = 0;
    while( true ) {
      bVar1 = s1[lVar4];
      if (bVar1 == 0) {
        return -1;
      }
      bVar2 = s2[lVar4];
      if (bVar2 == 0) break;
      iVar3 = bVar1 + 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        iVar3 = (int)(char)bVar1;
      }
      iVar5 = bVar2 + 0x20;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        iVar5 = (int)(char)bVar2;
      }
      if ((n - 1 == lVar4) || (lVar4 = lVar4 + 1, iVar3 - iVar5 != 0)) {
        return iVar3 - iVar5;
      }
    }
  }
  return 1;
}

Assistant:

static int InternStrnicmp(const char* s1, const char* s2, size_t n)
{
    int result;

    if (s1 == NULL)
    {
        result = -1;
    }
    else if (s2 == NULL)
    {
        result = 1;
    }
    else
    {
        result = 0;

        while (n-- && result == 0)
        {
            if (*s1 == 0) result = -1;
            else if (*s2 == 0) result = 1;
            else
            {

                result = TOLOWER(*s1) - TOLOWER(*s2);
                ++s1;
                ++s2;
            }
        }
    }
    return result;
}